

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O2

IOStream * __thiscall Assimp::BlobIOSystem::Open(BlobIOSystem *this,char *pFile,char *pMode)

{
  BlobIOStream *this_00;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (*pMode == 'w') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pFile,&local_39);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->created,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    this_00 = (BlobIOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x58);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pFile,&local_39);
    BlobIOStream::BlobIOStream(this_00,this,&local_38,0x1000);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    this_00 = (BlobIOStream *)0x0;
  }
  return &this_00->super_IOStream;
}

Assistant:

virtual IOStream* Open(const char* pFile,
        const char* pMode)
    {
        if (pMode[0] != 'w') {
            return NULL;
        }

        created.insert(std::string(pFile));
        return new BlobIOStream(this,std::string(pFile));
    }